

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_bitset_container_intersection
                (run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint16_t *puVar4;
  uint64_t *puVar5;
  uint uVar6;
  int iVar7;
  array_container_t *paVar8;
  bitset_container_t *pbVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  int32_t n_runs;
  int32_t iVar13;
  long lVar14;
  uint32_t runValue;
  int iVar15;
  uint uVar16;
  rle16_t *runs;
  ulong uVar17;
  
  prVar3 = src_1->runs;
  uVar16 = src_1->n_runs;
  uVar12 = (ulong)uVar16;
  if (((uVar12 == 1) && (prVar3->value == 0)) && (prVar3->length == 0xffff)) {
    if ((bitset_container_t *)*dst == src_2) {
      return true;
    }
    pbVar9 = bitset_container_clone(src_2);
    *dst = pbVar9;
    return true;
  }
  lVar14 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar14 + 4) & 0x20) == 0) {
    uVar6 = uVar16;
    if (0 < (int)uVar16) {
      uVar11 = 0;
      uVar17 = uVar12;
      do {
        uVar6 = (int)uVar17 + (uint)prVar3[uVar11].length;
        uVar17 = (ulong)uVar6;
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
    }
  }
  else {
    uVar6 = _avx2_run_container_cardinality(src_1);
  }
  if ((int)uVar6 < 0x1001) {
    uVar16 = src_2->cardinality;
    if ((int)uVar6 < src_2->cardinality) {
      uVar16 = uVar6;
    }
    paVar8 = array_container_create_given_capacity(uVar16);
    *dst = paVar8;
    if ((paVar8 != (array_container_t *)0x0) && (iVar7 = src_1->n_runs, 0 < (long)iVar7)) {
      prVar3 = src_1->runs;
      puVar4 = paVar8->array;
      puVar5 = src_2->words;
      iVar13 = paVar8->cardinality;
      lVar14 = 0;
      do {
        uVar12 = (ulong)prVar3[lVar14].value;
        iVar15 = prVar3[lVar14].length + 1;
        do {
          puVar4[iVar13] = (uint16_t)uVar12;
          iVar13 = iVar13 + (uint)((*(ulong *)((long)puVar5 + (ulong)((uint)(uVar12 >> 3) & 0x1ff8))
                                    >> (uVar12 & 0x3f) & 1) != 0);
          uVar12 = (ulong)((int)uVar12 + 1);
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
        lVar14 = lVar14 + 1;
      } while (lVar14 != iVar7);
      paVar8->cardinality = iVar13;
    }
  }
  else {
    pbVar9 = (bitset_container_t *)*dst;
    if (pbVar9 == src_2) {
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      else {
        puVar5 = src_2->words;
        uVar17 = 0;
        uVar16 = 0;
        do {
          uVar1 = prVar3[uVar17].value;
          uVar2 = prVar3[uVar17].length;
          if (uVar16 != uVar1) {
            uVar6 = uVar16 >> 6;
            uVar11 = -1L << ((byte)uVar16 & 0x3f);
            uVar16 = uVar1 - 1 >> 6;
            if (uVar16 - uVar6 == 0) {
              bVar10 = -(char)uVar1;
              uVar11 = (uVar11 << (bVar10 & 0x3f)) >> (bVar10 & 0x3f);
              uVar16 = uVar6;
            }
            else {
              puVar5[uVar6] = puVar5[uVar6] & ~uVar11;
              if (uVar6 + 1 < uVar16) {
                memset(puVar5 + (ulong)uVar6 + 1,0,(ulong)((uVar16 - uVar6) - 2) * 8 + 8);
              }
              uVar11 = 0xffffffffffffffff >> (-(char)uVar1 & 0x3fU);
            }
            puVar5[uVar16] = puVar5[uVar16] & ~uVar11;
          }
          uVar16 = (uint)uVar1 + (uint)uVar2 + 1;
          uVar17 = uVar17 + 1;
        } while (uVar12 != uVar17);
      }
      if (uVar16 != 0x10000) {
        puVar5 = src_2->words;
        uVar6 = uVar16 >> 6;
        puVar5[uVar6] = puVar5[uVar6] & ~(-1L << ((byte)uVar16 & 0x3f));
        if (uVar6 != 0x3ff) {
          if (uVar16 < 0xff80) {
            memset((void *)((long)puVar5 + (ulong)(uVar16 >> 3 & 0x1ff8) + 8),0,
                   (ulong)(0x3fd - uVar6) * 8 + 8);
          }
          puVar5[0x3ff] = 0;
        }
      }
      iVar7 = bitset_container_compute_cardinality(pbVar9);
      pbVar9->cardinality = iVar7;
      if (0x1000 < src_2->cardinality) {
        return 0x1000 < src_2->cardinality;
      }
      paVar8 = array_container_from_bitset(src_2);
      *dst = paVar8;
    }
    else {
      pbVar9 = bitset_container_clone(src_2);
      *dst = pbVar9;
      if (pbVar9 == (bitset_container_t *)0x0) {
        return true;
      }
      iVar7 = src_1->n_runs;
      if ((long)iVar7 < 1) {
        uVar16 = 0;
      }
      else {
        prVar3 = src_1->runs;
        puVar5 = pbVar9->words;
        lVar14 = 0;
        uVar16 = 0;
        do {
          uVar1 = prVar3[lVar14].value;
          uVar2 = prVar3[lVar14].length;
          if (uVar16 != uVar1) {
            uVar6 = uVar16 >> 6;
            uVar12 = -1L << ((byte)uVar16 & 0x3f);
            uVar16 = uVar1 - 1 >> 6;
            if (uVar16 - uVar6 == 0) {
              bVar10 = -(char)uVar1;
              uVar12 = (uVar12 << (bVar10 & 0x3f)) >> (bVar10 & 0x3f);
              uVar16 = uVar6;
            }
            else {
              puVar5[uVar6] = puVar5[uVar6] & ~uVar12;
              if (uVar6 + 1 < uVar16) {
                memset(puVar5 + (ulong)uVar6 + 1,0,(ulong)((uVar16 - uVar6) - 2) * 8 + 8);
              }
              uVar12 = 0xffffffffffffffff >> (-(char)uVar1 & 0x3fU);
            }
            puVar5[uVar16] = puVar5[uVar16] & ~uVar12;
          }
          uVar16 = (uint)uVar2 + (uint)uVar1 + 1;
          lVar14 = lVar14 + 1;
        } while (iVar7 != lVar14);
      }
      if (uVar16 != 0x10000) {
        puVar5 = pbVar9->words;
        uVar6 = uVar16 >> 6;
        puVar5[uVar6] = puVar5[uVar6] & ~(-1L << ((byte)uVar16 & 0x3f));
        if (uVar6 != 0x3ff) {
          if (uVar16 < 0xff80) {
            memset((void *)((long)puVar5 + (ulong)(uVar16 >> 3 & 0x1ff8) + 8),0,
                   (ulong)(0x3fd - uVar6) * 8 + 8);
          }
          puVar5[0x3ff] = 0;
        }
      }
      iVar7 = bitset_container_compute_cardinality(pbVar9);
      pbVar9->cardinality = iVar7;
      if (0x1000 < iVar7) {
        return 0x1000 < iVar7;
      }
      paVar8 = array_container_from_bitset(pbVar9);
      bitset_container_free((bitset_container_t *)*dst);
      *dst = paVar8;
    }
  }
  return false;
}

Assistant:

bool run_bitset_container_intersection(
    const run_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst
){
    if (run_container_is_full(src_1)) {
        if (*dst != src_2) *dst = bitset_container_clone(src_2);
        return true;
    }
    int32_t card = run_container_cardinality(src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        // result can only be an array (assuming that we never make a
        // RunContainer)
        if (card > src_2->cardinality) {
            card = src_2->cardinality;
        }
        array_container_t *answer = array_container_create_given_capacity(card);
        *dst = answer;
        if (*dst == NULL) {
            return false;
        }
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];
            uint32_t endofrun = (uint32_t)rle.value + rle.length;
            for (uint32_t runValue = rle.value; runValue <= endofrun;
                 ++runValue) {
                answer->array[answer->cardinality] = (uint16_t)runValue;
                answer->cardinality +=
                    bitset_container_contains(src_2, runValue);
            }
        }
        return false;
    }
    if (*dst == src_2) {  // we attempt in-place
        bitset_container_t *answer = CAST_bitset(*dst);
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(src_2->words, start, end);

            start = end + rle.length + 1;
        }
        bitset_reset_range(src_2->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);
        if (src_2->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(src_2);
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    } else {  // no inplace
        // we expect the answer to be a bitmap (if we are lucky)
        bitset_container_t *answer = bitset_container_clone(src_2);

        *dst = answer;
        if (answer == NULL) {
            return true;
        }
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(answer->words, start, end);
            start = end + rle.length + 1;
        }
        bitset_reset_range(answer->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);

        if (answer->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(answer);
            bitset_container_free(CAST_bitset(*dst));
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    }
}